

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir_resize_init(STBIR_RESIZE *resize,void *input_pixels,int input_w,int input_h,
                      int input_stride_in_bytes,void *output_pixels,int output_w,int output_h,
                      int output_stride_in_bytes,stbir_pixel_layout pixel_layout,
                      stbir_datatype data_type)

{
  resize->input_pixels = input_pixels;
  resize->input_w = input_w;
  resize->input_h = input_h;
  resize->input_stride_in_bytes = input_stride_in_bytes;
  resize->output_pixels = output_pixels;
  resize->output_w = output_w;
  resize->output_h = output_h;
  resize->output_stride_in_bytes = output_stride_in_bytes;
  resize->fast_alpha = 0;
  resize->input_cb = (stbir_input_callback *)0x0;
  resize->output_cb = (stbir_output_callback *)0x0;
  resize->user_data = resize;
  resize->called_alloc = 0;
  resize->input_s0 = 0.0;
  resize->input_t0 = 0.0;
  resize->horizontal_filter = STBIR_FILTER_DEFAULT;
  resize->vertical_filter = STBIR_FILTER_DEFAULT;
  resize->horizontal_edge = STBIR_EDGE_CLAMP;
  resize->vertical_edge = STBIR_EDGE_CLAMP;
  resize->horizontal_filter_kernel = (stbir__kernel_callback *)0x0;
  resize->horizontal_filter_support = (stbir__support_callback *)0x0;
  resize->vertical_filter_kernel = (stbir__kernel_callback *)0x0;
  resize->vertical_filter_support = (stbir__support_callback *)0x0;
  resize->samplers = (stbir__info *)0x0;
  resize->input_s1 = 1.0;
  resize->input_t1 = 1.0;
  resize->output_subx = 0;
  resize->output_suby = 0;
  resize->output_subw = output_w;
  resize->output_subh = output_h;
  resize->input_data_type = data_type;
  resize->output_data_type = data_type;
  resize->input_pixel_layout_public = pixel_layout;
  resize->output_pixel_layout_public = pixel_layout;
  resize->needs_rebuild = 1;
  return;
}

Assistant:

STBIRDEF void stbir_resize_init( STBIR_RESIZE * resize,
                                 const void *input_pixels,  int input_w,  int input_h, int input_stride_in_bytes, // stride can be zero
                                       void *output_pixels, int output_w, int output_h, int output_stride_in_bytes, // stride can be zero
                                 stbir_pixel_layout pixel_layout, stbir_datatype data_type )
{
  resize->input_pixels = input_pixels;
  resize->input_w = input_w;
  resize->input_h = input_h;
  resize->input_stride_in_bytes = input_stride_in_bytes;
  resize->output_pixels = output_pixels;
  resize->output_w = output_w;
  resize->output_h = output_h;
  resize->output_stride_in_bytes = output_stride_in_bytes;
  resize->fast_alpha = 0;

  stbir__init_and_set_layout( resize, pixel_layout, data_type );
}